

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::setRootIndex(QAbstractItemView *this,QModelIndex *index)

{
  bool bVar1;
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  ulong uVar3;
  QModelIndex *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QAccessibleTableModelChangeEvent accessibleEvent;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  char local_58 [32];
  QAccessibleTableModelChangeEvent local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractItemView *)0x802715);
  bVar1 = QModelIndex::isValid((QModelIndex *)in_RDI);
  in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c & 0xffffff;
  if (bVar1) {
    pQVar2 = QModelIndex::model((QModelIndex *)0x80273d);
    in_stack_ffffffffffffff8c = CONCAT13(pQVar2 != this_00->model,(int3)in_stack_ffffffffffffff8c);
  }
  if ((char)(in_stack_ffffffffffffff8c >> 0x18) == '\0') {
    QPersistentModelIndex::operator=(&this_00->root,in_RSI);
    uVar3 = QAccessible::isActive();
    if ((uVar3 & 1) != 0) {
      memset(local_38,0xaa,0x30);
      QAccessibleTableModelChangeEvent::QAccessibleTableModelChangeEvent
                ((QAccessibleTableModelChangeEvent *)this_00,
                 (QObject *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (ModelChangeType)((ulong)in_RDI >> 0x20));
      QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
      QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent(local_38);
    }
    QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,in_stack_ffffffffffffff8c);
    QAbstractItemViewPrivate::updateGeometry(in_RDI);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff78);
    QMessageLogger::warning
              (local_58,
               "QAbstractItemView::setRootIndex failed : index must be from the currently set model"
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::setRootIndex(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (Q_UNLIKELY(index.isValid() && index.model() != d->model)) {
        qWarning("QAbstractItemView::setRootIndex failed : index must be from the currently set model");
        return;
    }
    d->root = index;
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(this, QAccessibleTableModelChangeEvent::ModelReset);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    d->doDelayedItemsLayout();
    d->updateGeometry();
}